

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void scalar_cmov_test(void)

{
  int iVar1;
  secp256k1_scalar a;
  secp256k1_scalar r;
  secp256k1_scalar local_40;
  secp256k1_scalar local_20;
  
  local_20.d[0] = 0xffffffffffffffff;
  local_20.d[1] = 0xffffffffffffffff;
  local_20.d[2] = 0xffffffffffffffff;
  local_20.d[3] = 0xffffffffffffffff;
  memset(&local_40,0,0x20);
  secp256k1_scalar_cmov(&local_20,&local_40,0);
  iVar1 = secp256k1_memcmp_var(&local_20,&scalar_cmov_test::max,0x20);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1e82,"test condition failed: secp256k1_memcmp_var(&r, &max, sizeof(r)) == 0");
    abort();
  }
  local_20.d[0] = 0;
  local_20.d[1] = 0;
  local_20.d[2] = 0;
  local_20.d[3] = 0;
  local_40.d[0] = 0xffffffffffffffff;
  local_40.d[1] = 0xffffffffffffffff;
  local_40.d[2] = 0xffffffffffffffff;
  local_40.d[3] = 0xffffffffffffffff;
  secp256k1_scalar_cmov(&local_20,&local_40,1);
  iVar1 = secp256k1_memcmp_var(&local_20,&scalar_cmov_test::max,0x20);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1e86,"test condition failed: secp256k1_memcmp_var(&r, &max, sizeof(r)) == 0");
    abort();
  }
  local_40.d[0] = 0;
  local_40.d[1] = 0;
  local_40.d[2] = 0;
  local_40.d[3] = 0;
  secp256k1_scalar_cmov(&local_20,&local_40,1);
  iVar1 = secp256k1_memcmp_var(&local_20,&scalar_cmov_test::zero,0x20);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1e8a,"test condition failed: secp256k1_memcmp_var(&r, &zero, sizeof(r)) == 0");
    abort();
  }
  local_40.d[0] = 1;
  local_40.d[1] = 0;
  local_40.d[2] = 0;
  local_40.d[3] = 0;
  secp256k1_scalar_cmov(&local_20,&local_40,1);
  iVar1 = secp256k1_memcmp_var(&local_20,&scalar_cmov_test::one,0x20);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1e8e,"test condition failed: secp256k1_memcmp_var(&r, &one, sizeof(r)) == 0");
    abort();
  }
  local_20.d[0] = 1;
  local_20.d[1] = 0;
  local_20.d[2] = 0;
  local_20.d[3] = 0;
  local_40.d[0] = 0;
  local_40.d[1] = 0;
  local_40.d[2] = 0;
  local_40.d[3] = 0;
  secp256k1_scalar_cmov(&local_20,&local_40,0);
  iVar1 = secp256k1_memcmp_var(&local_20,&scalar_cmov_test::one,0x20);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1e92,"test condition failed: secp256k1_memcmp_var(&r, &one, sizeof(r)) == 0");
    abort();
  }
  return;
}

Assistant:

static void scalar_cmov_test(void) {
    static const secp256k1_scalar zero = SECP256K1_SCALAR_CONST(0, 0, 0, 0, 0, 0, 0, 0);
    static const secp256k1_scalar one = SECP256K1_SCALAR_CONST(0, 0, 0, 0, 0, 0, 0, 1);
    static const secp256k1_scalar max = SECP256K1_SCALAR_CONST(
        0xFFFFFFFFUL, 0xFFFFFFFFUL, 0xFFFFFFFFUL, 0xFFFFFFFFUL,
        0xFFFFFFFFUL, 0xFFFFFFFFUL, 0xFFFFFFFFUL, 0xFFFFFFFFUL
    );
    secp256k1_scalar r = max;
    secp256k1_scalar a = zero;

    secp256k1_scalar_cmov(&r, &a, 0);
    CHECK(secp256k1_memcmp_var(&r, &max, sizeof(r)) == 0);

    r = zero; a = max;
    secp256k1_scalar_cmov(&r, &a, 1);
    CHECK(secp256k1_memcmp_var(&r, &max, sizeof(r)) == 0);

    a = zero;
    secp256k1_scalar_cmov(&r, &a, 1);
    CHECK(secp256k1_memcmp_var(&r, &zero, sizeof(r)) == 0);

    a = one;
    secp256k1_scalar_cmov(&r, &a, 1);
    CHECK(secp256k1_memcmp_var(&r, &one, sizeof(r)) == 0);

    r = one; a = zero;
    secp256k1_scalar_cmov(&r, &a, 0);
    CHECK(secp256k1_memcmp_var(&r, &one, sizeof(r)) == 0);
}